

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> * __thiscall
args::EitherFlag::GetShort
          (unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
           *__return_storage_ptr__,EitherFlag *this,initializer_list<args::EitherFlag> flags)

{
  const_iterator pEVar1;
  EitherFlag *flag;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<args::EitherFlag> *__range2;
  undefined1 local_20 [8];
  initializer_list<args::EitherFlag> flags_local;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *shortFlags;
  
  flags_local._M_array = flags._M_array;
  local_20 = (undefined1  [8])this;
  flags_local._M_len = (size_type)__return_storage_ptr__;
  std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
  unordered_set(__return_storage_ptr__);
  __end2 = std::initializer_list<args::EitherFlag>::begin
                     ((initializer_list<args::EitherFlag> *)local_20);
  pEVar1 = std::initializer_list<args::EitherFlag>::end
                     ((initializer_list<args::EitherFlag> *)local_20);
  for (; __end2 != pEVar1; __end2 = __end2 + 1) {
    if ((__end2->isShort & 1U) != 0) {
      std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::insert
                (__return_storage_ptr__,&__end2->shortFlag);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::unordered_set<char> GetShort(std::initializer_list<EitherFlag> flags)
        {
            std::unordered_set<char>  shortFlags;
            for (const EitherFlag &flag: flags)
            {
                if (flag.isShort)
                {
                    shortFlags.insert(flag.shortFlag);
                }
            }
            return shortFlags;
        }